

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O0

void __thiscall gnilk::LogManager::Initialize(LogManager *this)

{
  IPCMechanism IVar1;
  bool bVar2;
  uint uVar3;
  element_type *peVar4;
  type local_60;
  thread local_58;
  shared_ptr<gnilk::LogIPCQueue> local_50;
  shared_ptr<gnilk::LogIPCPipeUnix> local_40;
  shared_ptr<gnilk::LogIPCFifoUnix> local_30;
  shared_ptr<gnilk::LogCache> local_20;
  LogManager *local_10;
  LogManager *this_local;
  
  if ((this->isInitialized & 1U) != 0) {
    return;
  }
  local_10 = this;
  LogCache::Create((size_t)&local_20);
  std::shared_ptr<gnilk::LogCache>::operator=(&this->cache,&local_20);
  std::shared_ptr<gnilk::LogCache>::~shared_ptr(&local_20);
  RegisterDefaultSinks(this);
  bVar2 = std::operator==(&this->ipcHandler,(nullptr_t)0x0);
  if (!bVar2) goto LAB_001aeba6;
  IVar1 = this->ipcMechanism;
  if (IVar1 == kQueue) {
LAB_001aeb5d:
    std::make_shared<gnilk::LogIPCQueue>();
    std::shared_ptr<gnilk::LogIPCBase>::operator=(&this->ipcHandler,&local_50);
    std::shared_ptr<gnilk::LogIPCQueue>::~shared_ptr(&local_50);
  }
  else if (IVar1 == kFifo) {
    std::make_shared<gnilk::LogIPCFifoUnix>();
    std::shared_ptr<gnilk::LogIPCBase>::operator=(&this->ipcHandler,&local_30);
    std::shared_ptr<gnilk::LogIPCFifoUnix>::~shared_ptr(&local_30);
  }
  else {
    if (IVar1 != kPipe) goto LAB_001aeb5d;
    std::make_shared<gnilk::LogIPCPipeUnix>();
    std::shared_ptr<gnilk::LogIPCBase>::operator=(&this->ipcHandler,&local_40);
    std::shared_ptr<gnilk::LogIPCPipeUnix>::~shared_ptr(&local_40);
  }
  peVar4 = std::__shared_ptr_access<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->ipcHandler);
  uVar3 = (*peVar4->_vptr_LogIPCBase[2])();
  if ((uVar3 & 1) == 0) {
    exit(1);
  }
LAB_001aeba6:
  this->isInitialized = true;
  local_60.this = this;
  std::thread::thread<gnilk::LogManager::Initialize()::__0,,void>(&local_58,&local_60);
  std::thread::operator=(&this->sinkThread,&local_58);
  std::thread::~thread(&local_58);
  return;
}

Assistant:

void LogManager::Initialize() {
    if (isInitialized) {
        return;
    }

    // IF we support some kind of configuration - except for compile time - we should deal with it here..
    // Option 2 - copy the 'property' object concept over from old logger and set all defaults in it - let the
    // app have the ability to supply/create/modify the Property object before we initialize...

    cache = LogCache::Create(cacheCapacity);

    RegisterDefaultSinks();

    // This should NOT happen - but let's check anyway...
    if (ipcHandler == nullptr) {
        switch(ipcMechanism) {
#ifndef WIN32
            case IPCMechanism::kFifo :
                ipcHandler = std::make_shared<LogIPCFifoUnix>();
                break;
            case IPCMechanism::kPipe :
                ipcHandler = std::make_shared<LogIPCPipeUnix>();
                break;
#endif
            case IPCMechanism::kQueue :
            default:
                ipcHandler = std::make_shared<LogIPCQueue>();
                break;
        }
        if (!ipcHandler->Open()) {
            exit(1);
        }
    }

    isInitialized = true;

    sinkThread = std::thread([this]() {
        bQuitSinkThread = false;
        SinkThread();
    });


}